

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestHugeFieldNumbersLite::_InternalSerialize
          (TestHugeFieldNumbersLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *pRVar1;
  MapFieldLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint uVar2;
  ForeignMessageLite *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  MessageLite *value_00;
  int iVar3;
  uint uVar4;
  byte *ptr;
  uint8_t *puVar5;
  const_reference piVar6;
  const_pointer piVar7;
  byte *pbVar8;
  ulong uVar9;
  undefined8 *puVar10;
  char *pcVar11;
  size_t sVar12;
  uint uVar13;
  uint32_t uVar14;
  int *piVar15;
  long lVar16;
  int index;
  string_view s;
  string_view s_00;
  string_view s_01;
  const_iterator __begin3;
  UntypedMapIterator local_48;
  
  ptr = google::protobuf::internal::ExtensionSet::_InternalSerializeAll
                  (&(this->field_0)._impl_._extensions_,
                   (MessageLite *)_TestHugeFieldNumbersLite_default_instance_,target,stream);
  uVar2 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar2 & 0x10) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,ptr);
    ptr = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                    (0x1ffffc70,(this->field_0)._impl_.optional_int32_,puVar5);
  }
  if ((uVar2 & 0x20) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,ptr);
    ptr = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                    (0x1ffffc71,(this->field_0)._impl_.fixed_32_,puVar5);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_int32_;
  iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
  index = 0;
  if (iVar3 < 1) {
    iVar3 = index;
  }
  for (; iVar3 != index; index = index + 1) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,ptr);
    piVar6 = google::protobuf::RepeatedField<int>::Get(pRVar1,index);
    ptr = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x1ffffc72,*piVar6,puVar5);
  }
  uVar13 = *(uint *)((long)&this->field_0 + 0x40);
  if (0 < (int)uVar13) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,ptr);
    if (stream->end_ <= puVar5) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_48);
    }
    pRVar1 = &(this->field_0)._impl_.packed_int32_;
    ptr = puVar5 + 2;
    for (uVar4 = 0xffffe39a; 0x7f < uVar4; uVar4 = uVar4 >> 7) {
      ptr[-2] = (byte)uVar4 | 0x80;
      ptr = ptr + 1;
    }
    ptr[-2] = 0xf;
    for (; 0x7f < uVar13; uVar13 = uVar13 >> 7) {
      ptr[-1] = (byte)uVar13 | 0x80;
      ptr = ptr + 1;
    }
    ptr[-1] = (byte)uVar13;
    piVar7 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar15 = piVar7 + iVar3;
    do {
      pbVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,ptr);
      uVar9 = (ulong)*piVar7;
      while( true ) {
        ptr = pbVar8 + 1;
        if (uVar9 < 0x80) break;
        *pbVar8 = (byte)uVar9 | 0x80;
        uVar9 = uVar9 >> 7;
        pbVar8 = ptr;
      }
      piVar7 = piVar7 + 1;
      *pbVar8 = (byte)uVar9;
    } while (piVar7 < piVar15);
  }
  if ((uVar2 & 0x40) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,ptr);
    ptr = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                    (0x1ffffc74,(this->field_0)._impl_.optional_enum_,puVar5);
  }
  if ((uVar2 & 1) != 0) {
    puVar10 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
    ;
    s._M_str = (char *)*puVar10;
    s._M_len = puVar10[1];
    ptr = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                    (stream,0x1ffffc75,s,ptr);
  }
  if ((uVar2 & 2) != 0) {
    puVar10 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    s_00._M_str = (char *)*puVar10;
    s_00._M_len = puVar10[1];
    ptr = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                    (stream,0x1ffffc76,s_00,ptr);
  }
  if ((uVar2 & 4) != 0) {
    value = (this->field_0)._impl_.optional_message_;
    ptr = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                    (0x1ffffc77,&value->super_MessageLite,*(int *)((long)&value->field_0 + 4),ptr,
                     stream);
  }
  if ((uVar2 & 8) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,ptr);
    ptr = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                    (0x1ffffc78,&((this->field_0)._impl_.optionalgroup_)->super_MessageLite,puVar5,
                     stream);
  }
  iVar3 = *(int *)((long)&this->field_0 + 0x48);
  if (iVar3 != 0) {
    this_00 = &(this->field_0)._impl_.string_string_map_;
    if ((iVar3 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::internal::UntypedMapBase::begin(&local_48,(UntypedMapBase *)this_00);
      while (local_48.node_ != (NodeBase *)0x0) {
        ptr = google::protobuf::internal::
              MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
              ::InternalSerialize(0x1ffffc7a,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_48.node_ + 1),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_48.node_ + 5),ptr,stream);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&local_48);
      }
    }
    else {
      google::protobuf::internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterPtr((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,
                     (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00);
      for (lVar16 = 0; (long)local_48.node_ << 3 != lVar16; lVar16 = lVar16 + 8) {
        key = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               ((long)&(local_48.m_)->num_elements_ + lVar16);
        ptr = google::protobuf::internal::
              MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
              ::InternalSerialize(0x1ffffc7a,key,key + 1,ptr,stream);
      }
      std::unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_>::~unique_ptr
                ((unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_> *)&local_48.m_);
    }
  }
  switch((this->field_0)._impl_._oneof_case_[0]) {
  case 0x1ffffc7b:
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,ptr);
    uVar14 = 0;
    if ((this->field_0)._impl_._oneof_case_[0] == 0x1ffffc7b) {
      uVar14 = *(uint32_t *)((long)&this->field_0 + 0x98);
    }
    ptr = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(0x1ffffc7b,uVar14,puVar5);
    break;
  case 0x1ffffc7c:
    value_00 = *(MessageLite **)((long)&this->field_0 + 0x98);
    ptr = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                    (0x1ffffc7c,value_00,(int)value_00[1]._internal_metadata_.ptr_,ptr,stream);
    break;
  case 0x1ffffc7d:
    puVar10 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.oneof_field_.oneof_test_all_types_ & 0xfffffffffffffffc
              );
    pcVar11 = (char *)*puVar10;
    sVar12 = puVar10[1];
    uVar14 = 0x1ffffc7d;
    goto LAB_00ab2966;
  case 0x1ffffc7e:
    puVar10 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.oneof_field_.oneof_test_all_types_ & 0xfffffffffffffffc
              );
    pcVar11 = (char *)*puVar10;
    sVar12 = puVar10[1];
    uVar14 = 0x1ffffc7e;
LAB_00ab2966:
    s_01._M_str = pcVar11;
    s_01._M_len = sVar12;
    ptr = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,uVar14,s_01,ptr)
    ;
  }
  uVar9 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar9 & 1) != 0) {
    uVar9 = uVar9 & 0xfffffffffffffffe;
    ptr = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                    (stream,*(void **)(uVar9 + 8),*(int *)(uVar9 + 0x10),ptr);
  }
  return ptr;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestHugeFieldNumbersLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestHugeFieldNumbersLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 optional_int32 = 536870000;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870000, this_._internal_optional_int32(), target);
  }

  // int32 fixed_32 = 536870001;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870001, this_._internal_fixed_32(), target);
  }

  // repeated int32 repeated_int32 = 536870002;
  for (int i = 0, n = this_._internal_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870002, this_._internal_repeated_int32().Get(i), target);
  }

  // repeated int32 packed_int32 = 536870003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          536870003, this_._internal_packed_int32(), byte_size, target);
    }
  }

  // .proto2_unittest.ForeignEnumLite optional_enum = 536870004;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        536870004, this_._internal_optional_enum(), target);
  }

  // string optional_string = 536870005;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_optional_string();
    target = stream->WriteStringMaybeAliased(536870005, _s, target);
  }

  // bytes optional_bytes = 536870006;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_optional_bytes();
    target = stream->WriteBytesMaybeAliased(536870006, _s, target);
  }

  // .proto2_unittest.ForeignMessageLite optional_message = 536870007;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        536870007, *this_._impl_.optional_message_, this_._impl_.optional_message_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestHugeFieldNumbersLite.OptionalGroup optionalgroup = 536870008 [features = {
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        536870008, *this_._impl_.optionalgroup_, target, stream);
  }

  // map<string, string> string_string_map = 536870010;
  if (!this_._internal_string_string_map().empty()) {
    using MapType = ::google::protobuf::Map<std::string, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<std::string, std::string,
                                   _pbi::WireFormatLite::TYPE_STRING,
                                   _pbi::WireFormatLite::TYPE_STRING>;
    const auto& field = this_._internal_string_string_map();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterPtr<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            536870010, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            536870010, entry.first, entry.second, target, stream);
      }
    }
  }

  switch (this_.oneof_field_case()) {
    case kOneofUint32: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
          536870011, this_._internal_oneof_uint32(), target);
      break;
    }
    case kOneofTestAllTypes: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          536870012, *this_._impl_.oneof_field_.oneof_test_all_types_, this_._impl_.oneof_field_.oneof_test_all_types_->GetCachedSize(), target,
          stream);
      break;
    }
    case kOneofString: {
      const ::std::string& _s = this_._internal_oneof_string();
      target = stream->WriteStringMaybeAliased(536870013, _s, target);
      break;
    }
    case kOneofBytes: {
      const ::std::string& _s = this_._internal_oneof_bytes();
      target = stream->WriteBytesMaybeAliased(536870014, _s, target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestHugeFieldNumbersLite)
  return target;
}